

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O1

void __thiscall
avro::detail::BufferImpl::copyData
          (BufferImpl *this,BufferImpl *dest,const_iterator *iter,size_type offset,size_type bytes)

{
  data_type **ppdVar1;
  _Elt_pointer pCVar2;
  _Map_pointer ppCVar3;
  Chunk *pCVar4;
  _Elt_pointer pCVar5;
  data_type *pdVar6;
  
  if (bytes == 0) {
    pdVar6 = (data_type *)0x0;
  }
  else {
    pdVar6 = (data_type *)0x0;
    do {
      std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::push_back
                (&dest->readChunks_,iter->_M_cur);
      pCVar5 = (dest->readChunks_).
               super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pCVar5 == (dest->readChunks_).
                    super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppdVar1 = &(dest->readChunks_).
                   super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1][8].readPos_;
        *ppdVar1 = *ppdVar1 + offset;
        pCVar5 = (dest->readChunks_).
                 super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
      }
      else {
        pCVar5[-1].readPos_ = pCVar5[-1].readPos_ + offset;
      }
      pdVar6 = pCVar5[-1].writePos_ + ((long)pdVar6 - (long)pCVar5[-1].readPos_);
      pCVar2 = iter->_M_cur;
      iter->_M_cur = pCVar2 + 1;
      if (pCVar2 + 1 == iter->_M_last) {
        ppCVar3 = iter->_M_node;
        iter->_M_node = ppCVar3 + 1;
        pCVar4 = ppCVar3[1];
        iter->_M_first = pCVar4;
        iter->_M_last = pCVar4 + 9;
        iter->_M_cur = pCVar4;
      }
      offset = 0;
    } while (pdVar6 < bytes);
  }
  pCVar5 = (dest->readChunks_).
           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pCVar5 == (dest->readChunks_).
                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pCVar5 = (dest->readChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 9;
  }
  pCVar5[-1].writePos_ = pCVar5[-1].writePos_ + (bytes - (long)pdVar6);
  dest->size_ = dest->size_ + bytes;
  return;
}

Assistant:

void copyData(BufferImpl &dest, 
                  ChunkList::const_iterator iter,
                  size_type offset, 
                  size_type bytes) const
    {
        // now we are positioned to start the copying, copy as many
        // chunks as we need, the first chunk may have a non-zero offset 
        // if the data to copy is not at the start of the chunk 
        size_type copied = 0;
        while(copied < bytes) {

            dest.readChunks_.push_back(*iter);

            // offset only applies in the first chunk, 
            // all subsequent chunks are copied from the start
            dest.readChunks_.back().truncateFront(offset);
            offset = 0;

            copied += dest.readChunks_.back().dataSize(); 
            ++iter;
        }

        // if the last chunk copied has more bytes than we need, truncate it
        size_type excess = copied - bytes;
        dest.readChunks_.back().truncateBack(excess);

        dest.size_ += bytes;
    }